

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1c0a25::ArchiveShellCommand::getVerboseDescription
          (ArchiveShellCommand *this,SmallVectorImpl<char> *result)

{
  bool bVar1;
  size_t in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  pointer pbVar2;
  StringRef Str;
  raw_svector_ostream stream;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  raw_ostream local_50;
  SmallVectorImpl<char> *local_28;
  
  local_50.BufferMode = InternalBuffer;
  local_50.OutBufStart = (char *)0x0;
  local_50.OutBufEnd = (char *)0x0;
  local_50.OutBufCur = (char *)0x0;
  local_50._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_00251be0;
  local_28 = result;
  llvm::raw_ostream::SetUnbuffered(&local_50);
  (anonymous_namespace)::ArchiveShellCommand::getArgs_abi_cxx11_(&local_68,this);
  if (local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = true;
    pbVar2 = local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (!bVar1) {
        Str.Length = 1;
        Str.Data = " ";
        llvm::raw_ostream::operator<<(&local_50,Str);
      }
      llvm::raw_ostream::write
                (&local_50,(int)(pbVar2->_M_dataplus)._M_p,(void *)pbVar2->_M_string_length,in_RCX);
      pbVar2 = pbVar2 + 1;
      bVar1 = false;
    } while (pbVar2 != local_68.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  llvm::raw_ostream::~raw_ostream(&local_50);
  return;
}

Assistant:

virtual void getVerboseDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream stream(result);
    bool first = true;
    for (const auto& arg: getArgs()) {
      if (!first) {
        stream << " ";
      }
      first = false;
      stream << arg;
    }
  }